

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::AssertionInstanceExpression::fromLookup
          (AssertionInstanceExpression *this,Symbol *symbol,InvocationExpressionSyntax *syntax,
          SourceRange range,ASTContext *parentContext)

{
  span<const_std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_18446744073709551615UL>
  *psVar1;
  group_type_pointer pgVar2;
  char *pcVar3;
  ExpressionKind EVar4;
  undefined4 uVar5;
  Compilation *this_00;
  _Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  _Var6;
  SyntaxNode *this_01;
  uint uVar7;
  undefined1 auVar8 [16];
  ushort uVar9;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  bool bVar10;
  AssertionInstanceDetails *pAVar11;
  bool bVar12;
  bool bVar14;
  uint uVar15;
  int iVar16;
  Type *args;
  Diagnostic *pDVar17;
  SourceLocation SVar18;
  byte bVar13;
  char_pointer puVar19;
  InvalidAssertionExpr *args_2;
  AssertionInstanceExpression *pAVar20;
  uint64_t uVar21;
  AssertionExpr *args_2_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AssertionInstanceDetails *pAVar22;
  char_pointer puVar23;
  ulong uVar24;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  size_t extraout_RDX;
  table_element_pointer ppVar25;
  string_view *psVar26;
  long lVar27;
  SyntaxKind typeKind;
  DiagCode code;
  DiagCode code_00;
  DiagCode code_01;
  ulong hash;
  ulong uVar28;
  char_pointer puVar29;
  opt_storage<const_slang::ast::Symbol_*> *poVar30;
  basic_string_view<char,_std::char_traits<char>_> *pbVar31;
  SmallVector<const_slang::ast::Symbol_*,_5UL> *context_00;
  SyntaxNode *propExpr;
  PropertySymbol *prop;
  ulong uVar32;
  long lVar33;
  opt_storage<const_slang::ast::Symbol_*> oVar34;
  uchar uVar35;
  uchar uVar40;
  uchar uVar41;
  byte bVar42;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  char cVar43;
  char cVar46;
  char cVar47;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  iterator iVar48;
  string_view sVar49;
  LookupLocation LVar50;
  SourceRange sourceRange_02;
  SourceRange SVar51;
  try_emplace_args_t local_491;
  AssertionInstanceExpression *local_490;
  opt_storage<const_slang::ast::Symbol_*> local_488;
  SourceRange range_local;
  ulong local_468;
  SourceLocation local_450;
  SmallVector<const_slang::ast::Symbol_*,_5UL> localVars;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  AssertionInstanceDetails *local_3a8;
  _Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false> local_3a0;
  undefined1 local_398 [16];
  ActualArg arg;
  undefined1 local_368 [24];
  size_t local_350;
  ulong local_348;
  group_type_pointer local_340;
  value_type_pointer local_338;
  size_ctrl_type local_330;
  size_t local_320;
  size_t local_318;
  group_type_pointer local_310;
  value_type_pointer local_308;
  size_ctrl_type local_300;
  undefined1 local_2f0 [16];
  bool local_2e0;
  ulong local_2d8;
  opt_storage<const_slang::ast::Symbol_*> *local_2d0;
  ASTContext context;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> orderedArgs;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
  x;
  SmallVector<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_4UL>
  actualArgs;
  NamedArgMap namedArgs;
  
  SVar18 = range.endLoc;
  range_local.endLoc = range.startLoc;
  this_00 = (Compilation *)**(undefined8 **)SVar18;
  range_local.startLoc = (SourceLocation)syntax;
  Compilation::noteReference(this_00,(Symbol *)this,false);
  EVar4 = (this->super_Expression).kind;
  if (EVar4 == 0x55) {
    args = this_00->voidType;
  }
  else {
    if (EVar4 == 0x50) {
      typeKind = PropertyType;
    }
    else {
      typeKind = SequenceType;
    }
    args = Compilation::getType(this_00,typeKind);
  }
  poVar30 = (opt_storage<const_slang::ast::Symbol_*> *)this[1].super_Expression.constant;
  _Var6 = (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           )this[1].super_Expression.syntax;
  orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_ =
       (pointer)orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.firstElement;
  orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len = 0;
  orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.cap = 5;
  namedArgs.super_Storage.ptr = (char *)&namedArgs;
  namedArgs._272_8_ = 0x3f;
  namedArgs._280_8_ = 1;
  namedArgs._288_16_ = ZEXT816(0x474ad0);
  namedArgs._304_16_ = (undefined1  [16])0x0;
  local_490 = this;
  namedArgs.super_Storage._264_8_ = namedArgs.super_Storage.ptr;
  if (((symbol == (Symbol *)0x0) || (symbol[1].location == (SourceLocation)0x0)) ||
     (bVar12 = Expression::collectArgs
                         ((ASTContext *)SVar18,(ArgumentListSyntax *)symbol[1].location,
                          &orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>,
                          &namedArgs), bVar12)) {
    context.assertionInstance = *(AssertionInstanceDetails **)((long)SVar18 + 0x30);
    context.scope.ptr = *(Scope **)SVar18;
    context._8_8_ = *(undefined8 *)((long)SVar18 + 8);
    context._16_16_ = *(undefined1 (*) [16])((long)SVar18 + 0x10);
    context.firstTempVar = *(TempVarSymbol **)((long)SVar18 + 0x20);
    context.randomizeDetails = *(RandomizeDetails **)((long)SVar18 + 0x28);
    ASTContext::tryFillAssertionDetails(&context);
    pAVar20 = local_490;
    local_350 = 0x3f;
    local_348 = 1;
    local_338 = (value_type_pointer)0x0;
    local_340 = (group_type_pointer)
                &boost::unordered::detail::foa::
                 dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                 ::storage;
    local_330.ml = 0;
    local_330.size = 0;
    local_320 = 0x3f;
    local_318 = 1;
    local_468 = 0;
    local_308 = (value_type_pointer)0x0;
    local_310 = (group_type_pointer)
                &boost::unordered::detail::foa::
                 dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                 ::storage;
    local_300.ml = 0;
    local_300.size = 0;
    local_2f0 = (undefined1  [16])0x0;
    local_2e0 = false;
    local_368._0_8_ = local_490;
    local_368._16_8_ = range_local.startLoc;
    local_368._8_8_ = &context;
    if (context.assertionInstance != (AssertionInstanceDetails *)0x0) {
      EVar4 = (local_490->super_Expression).kind;
      pAVar22 = context.assertionInstance;
      do {
        if ((AssertionInstanceExpression *)pAVar22->symbol == local_490) {
          if (EVar4 == 0x4f) {
            code.subsystem = Expressions;
            code.code = 0x90;
          }
          else {
            if (EVar4 != 0x55) {
              if (pAVar22->isRecursive != true) {
                local_2e0 = true;
                goto LAB_00422082;
              }
              actualArgs.
              super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
              .data_ = (pointer)0x0;
              args_2 = BumpAllocator::emplace<slang::ast::InvalidAssertionExpr,decltype(nullptr)>
                                 ((BumpAllocator *)this_00,(void **)&actualArgs);
              actualArgs.
              super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
              .data_ = (pointer)CONCAT71(actualArgs.
                                         super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
                                         .data_._1_7_,1);
              pAVar20 = BumpAllocator::
                        emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::InvalidAssertionExpr&,bool,slang::SourceRange&>
                                  ((BumpAllocator *)this_00,args,(Symbol *)pAVar20,args_2,
                                   (bool *)&actualArgs,&range_local);
              goto LAB_004222ec;
            }
            code.subsystem = Expressions;
            code.code = 0x8c;
          }
          SVar51.endLoc = range_local.endLoc;
          SVar51.startLoc = range_local.startLoc;
          pDVar17 = ASTContext::addDiag(&context,code,SVar51);
          sVar49._M_len = *(size_t *)&(pAVar20->super_Expression).type;
          sVar49._M_str = (char *)(pAVar20->super_Expression).constant;
          Diagnostic::operator<<(pDVar17,sVar49);
          pAVar20 = (AssertionInstanceExpression *)Expression::badExpr(this_00,(Expression *)0x0);
          goto LAB_004222ec;
        }
LAB_00422082:
        pAVar11 = pAVar22->argDetails;
        if (pAVar22->argDetails == (AssertionInstanceDetails *)0x0) {
          pAVar11 = pAVar22->prevContext->assertionInstance;
        }
        pAVar22 = pAVar11;
      } while (pAVar22 != (AssertionInstanceDetails *)0x0);
    }
    psVar1 = &local_490->arguments;
    actualArgs.
    super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
    .data_ = (pointer)actualArgs.
                      super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
                      .firstElement;
    actualArgs.
    super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
    .len = 0;
    actualArgs.
    super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
    .cap = 4;
    if (_Var6 == (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                  )0x0) {
      local_450 = (SourceLocation)0x0;
      bVar12 = false;
    }
    else {
      local_2d0 = poVar30 + (long)_Var6;
      bVar12 = false;
      local_468 = 0;
      local_450 = (SourceLocation)0x0;
      do {
        oVar34 = (opt_storage<const_slang::ast::Symbol_*>)poVar30->t_;
        localVars.stackBase[0x18] = '\0';
        local_488 = oVar34;
        bVar10 = bVar12;
        if (local_468 < orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len) {
          this_01 = orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_
                    [local_468];
          context_00 = (SmallVector<const_slang::ast::Symbol_*,_5UL> *)&context;
          propExpr = this_01;
          if (this_01->kind == EmptyArgument) {
            propExpr = *(SyntaxNode **)(oVar34.t_ + 2);
            LVar50 = LookupLocation::after(oVar34.t_);
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len =
                 CONCAT44(localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len._4_4_,
                          LVar50.index);
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[0] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[1] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[2] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[3] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[4] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[5] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[6] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[7] = '\0';
            localVars.stackBase[0] = '\0';
            localVars.stackBase[1] = '\0';
            localVars.stackBase[2] = '\0';
            localVars.stackBase[3] = '\0';
            localVars.stackBase[4] = '\0';
            localVars.stackBase[5] = '\0';
            localVars.stackBase[6] = '\0';
            localVars.stackBase[7] = '\0';
            localVars.stackBase[8] = '\0';
            localVars.stackBase[9] = '\0';
            localVars.stackBase[10] = '\0';
            localVars.stackBase[0xb] = '\0';
            localVars.stackBase[0xc] = '\0';
            localVars.stackBase[0xd] = '\0';
            localVars.stackBase[0xe] = '\0';
            localVars.stackBase[0xf] = '\0';
            localVars.stackBase[0x18] = '\x01';
            localVars.stackBase._16_8_ = local_368;
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 0x2000000000;
            context_00 = &localVars;
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)psVar1;
            if (propExpr == (SyntaxNode *)0x0) {
              if (((oVar34.t_)->name)._M_len == 0) {
                propExpr = (SyntaxNode *)0x0;
              }
              else {
                SVar51 = slang::syntax::SyntaxNode::sourceRange(this_01);
                pDVar17 = ASTContext::addDiag(&context,(DiagCode)0x7,SVar51);
                Diagnostic::operator<<(pDVar17,(oVar34.t_)->name);
                propExpr = (SyntaxNode *)0x0;
                context_00 = &localVars;
              }
            }
          }
          local_468 = (ulong)((int)local_468 + 1);
          psVar26 = &(oVar34.t_)->name;
          uVar21 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &namedArgs.super_Storage.field_0x108,psVar26);
          uVar32 = uVar21 >> (namedArgs._272_1_ & 0x3f);
          uVar5 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[uVar21 & 0xff];
          uVar24 = 0;
          do {
            pcVar3 = (char *)(namedArgs._288_8_ + uVar32 * 0x10);
            bVar13 = pcVar3[0xf];
            cVar43 = (char)uVar5;
            auVar39[0] = -(*pcVar3 == cVar43);
            cVar46 = (char)((uint)uVar5 >> 8);
            auVar39[1] = -(pcVar3[1] == cVar46);
            cVar47 = (char)((uint)uVar5 >> 0x10);
            auVar39[2] = -(pcVar3[2] == cVar47);
            bVar42 = (byte)((uint)uVar5 >> 0x18);
            auVar39[3] = -(pcVar3[3] == bVar42);
            auVar39[4] = -(pcVar3[4] == cVar43);
            auVar39[5] = -(pcVar3[5] == cVar46);
            auVar39[6] = -(pcVar3[6] == cVar47);
            auVar39[7] = -(pcVar3[7] == bVar42);
            auVar39[8] = -(pcVar3[8] == cVar43);
            auVar39[9] = -(pcVar3[9] == cVar46);
            auVar39[10] = -(pcVar3[10] == cVar47);
            auVar39[0xb] = -(pcVar3[0xb] == bVar42);
            auVar39[0xc] = -(pcVar3[0xc] == cVar43);
            auVar39[0xd] = -(pcVar3[0xd] == cVar46);
            auVar39[0xe] = -(pcVar3[0xe] == cVar47);
            auVar39[0xf] = -(bVar13 == bVar42);
            uVar15 = (uint)(ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe);
            if (uVar15 != 0) {
              local_398._0_8_ = psVar26;
              lVar27 = namedArgs._288_8_ + uVar32 * 0x10;
              lVar33 = namedArgs._296_8_ + uVar32 * 0x1e0;
              local_2d8 = uVar24;
              do {
                iVar16 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> iVar16 & 1) == 0; iVar16 = iVar16 + 1) {
                  }
                }
                pbVar31 = (basic_string_view<char,_std::char_traits<char>_> *)
                          ((ulong)(uint)(iVar16 << 5) + lVar33);
                bVar12 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)&namedArgs.super_Storage.field_0x108,
                                    (basic_string_view<char,_std::char_traits<char>_> *)
                                    local_398._0_8_,pbVar31);
                if (bVar12) {
                  SVar18 = parsing::Token::location((Token *)(pbVar31[1]._M_len + 0x28));
                  oVar34 = local_488;
                  pDVar17 = ASTContext::addDiag(&context,(DiagCode)0x4a0007,SVar18);
                  Diagnostic::operator<<(pDVar17,(oVar34.t_)->name);
                  local_3d8 = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(this_01);
                  pAVar20 = local_490;
                  SVar18 = parsing::Token::location((Token *)local_3d8);
                  Diagnostic::addNote(pDVar17,(DiagCode)0xc0001,SVar18);
                  *(undefined1 *)&pbVar31[1]._M_str = 1;
                  bVar10 = true;
                  goto LAB_00422a3b;
                }
                uVar15 = uVar15 - 1 & uVar15;
              } while (uVar15 != 0);
              bVar13 = *(byte *)(lVar27 + 0xf);
              uVar24 = local_2d8;
              psVar26 = (string_view *)local_398._0_8_;
            }
            pAVar20 = local_490;
            oVar34 = local_488;
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7] & bVar13) == 0) break;
            lVar33 = uVar32 + uVar24;
            uVar24 = uVar24 + 1;
            uVar32 = lVar33 + 1U & namedArgs._280_8_;
          } while (uVar24 <= (ulong)namedArgs._280_8_);
LAB_00422a3b:
          bVar12 = true;
          if (propExpr != (SyntaxNode *)0x0) {
LAB_00422a47:
            local_3a8 = *(AssertionInstanceDetails **)(context_00->stackBase + 0x10);
            local_3d8 = *(undefined1 (*) [16])
                         &context_00->super_SmallVectorBase<const_slang::ast::Symbol_*>;
            local_3c8._0_8_ = (context_00->super_SmallVectorBase<const_slang::ast::Symbol_*>).cap;
            local_3c8[8] = (context_00->super_SmallVectorBase<const_slang::ast::Symbol_*>).
                           firstElement[0];
            local_3c8[9] = (context_00->super_SmallVectorBase<const_slang::ast::Symbol_*>).
                           firstElement[1];
            local_3c8[10] =
                 (context_00->super_SmallVectorBase<const_slang::ast::Symbol_*>).firstElement[2];
            local_3c8[0xb] =
                 (context_00->super_SmallVectorBase<const_slang::ast::Symbol_*>).firstElement[3];
            local_3c8[0xc] =
                 (context_00->super_SmallVectorBase<const_slang::ast::Symbol_*>).firstElement[4];
            local_3c8[0xd] =
                 (context_00->super_SmallVectorBase<const_slang::ast::Symbol_*>).firstElement[5];
            local_3c8[0xe] =
                 (context_00->super_SmallVectorBase<const_slang::ast::Symbol_*>).firstElement[6];
            local_3c8[0xf] =
                 (context_00->super_SmallVectorBase<const_slang::ast::Symbol_*>).firstElement[7];
            local_3b8 = *(undefined1 (*) [16])context_00->stackBase;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = oVar34;
            hash = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
            uVar32 = hash >> ((byte)local_350._0_1_ & 0x3f);
            uVar5 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[hash & 0xff];
            uVar28 = 0;
            uVar24 = uVar32;
            do {
              pgVar2 = local_340 + uVar24;
              bVar13 = pgVar2->m[0xf].n;
              uVar35 = (uchar)uVar5;
              auVar45[0] = -(pgVar2->m[0].n == uVar35);
              uVar40 = (uchar)((uint)uVar5 >> 8);
              auVar45[1] = -(pgVar2->m[1].n == uVar40);
              uVar41 = (uchar)((uint)uVar5 >> 0x10);
              auVar45[2] = -(pgVar2->m[2].n == uVar41);
              bVar42 = (byte)((uint)uVar5 >> 0x18);
              auVar45[3] = -(pgVar2->m[3].n == bVar42);
              auVar45[4] = -(pgVar2->m[4].n == uVar35);
              auVar45[5] = -(pgVar2->m[5].n == uVar40);
              auVar45[6] = -(pgVar2->m[6].n == uVar41);
              auVar45[7] = -(pgVar2->m[7].n == bVar42);
              auVar45[8] = -(pgVar2->m[8].n == uVar35);
              auVar45[9] = -(pgVar2->m[9].n == uVar40);
              auVar45[10] = -(pgVar2->m[10].n == uVar41);
              auVar45[0xb] = -(pgVar2->m[0xb].n == bVar42);
              auVar45[0xc] = -(pgVar2->m[0xc].n == uVar35);
              auVar45[0xd] = -(pgVar2->m[0xd].n == uVar40);
              auVar45[0xe] = -(pgVar2->m[0xe].n == uVar41);
              auVar45[0xf] = -(bVar13 == bVar42);
              for (uVar15 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe);
                  local_3a0._M_head_impl = (PropertyExprSyntax *)propExpr, x.val.storage = oVar34,
                  uVar15 != 0; uVar15 = uVar15 - 1 & uVar15) {
                uVar7 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                  }
                }
                if ((AssertionPortSymbol *)local_488.t_ ==
                    (AssertionPortSymbol *)local_338[uVar24 * 0xf + (ulong)uVar7].first)
                goto LAB_00422bce;
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar13) == 0) break;
              lVar33 = uVar24 + uVar28;
              uVar28 = uVar28 + 1;
              uVar24 = lVar33 + 1U & local_348;
            } while (uVar28 <= local_348);
            if (local_330.size < local_330.ml) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
              ::
              nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                        ((locator *)&arg,
                         (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                          *)&local_350,(arrays_type *)&local_350,uVar32,hash,&local_491,
                         (Symbol **)&x,
                         (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *
                         )local_3d8);
              local_330.size = local_330.size + 1;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                        ((locator *)&arg,
                         (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                          *)&local_350,hash,&local_491,(Symbol **)&x,
                         (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *
                         )local_3d8);
            }
LAB_00422bce:
            oVar34 = local_488;
            arg.
            super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            ._M_u = (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                     )0x0;
            arg.
            super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            ._M_index = '\0';
            bVar14 = checkAssertionArg((PropertyExprSyntax *)propExpr,
                                       (AssertionPortSymbol *)local_488.t_,(ASTContext *)context_00,
                                       &arg,local_2e0);
            pAVar20 = local_490;
            bVar12 = true;
            if (bVar14) {
              local_3d8._9_7_ =
                   arg.
                   super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   ._9_7_;
              local_3d8[8] = arg.
                             super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             ._M_index;
              local_3d8._0_8_ =
                   arg.
                   super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   ._M_u;
              local_3c8._0_8_ = oVar34.t_;
              SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
              ::
              emplace_back<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
                        ((SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
                          *)&actualArgs,
                         (tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                          *)local_3d8);
              bVar12 = bVar10;
            }
            if (((((ulong)local_450 & 0xfffffff) == 0) &&
                ((((_Optional_base<slang::ast::ArgumentDirection,_true,_true> *)
                  &oVar34.t_[2].name._M_len)->_M_payload).
                 super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged == true)) &&
               ((((_Optional_base<slang::ast::ArgumentDirection,_true,_true> *)
                 &oVar34.t_[2].name._M_len)->_M_payload).
                super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload._M_value -
                Out < 2)) {
              local_450 = (oVar34.t_)->location;
            }
          }
        }
        else {
          psVar26 = &(oVar34.t_)->name;
          uVar21 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &namedArgs.super_Storage.field_0x108,psVar26);
          uVar32 = uVar21 >> (namedArgs._272_1_ & 0x3f);
          uVar5 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[uVar21 & 0xff];
          auVar44._4_4_ = uVar5;
          auVar44._0_4_ = uVar5;
          auVar44._8_4_ = uVar5;
          auVar44._12_4_ = uVar5;
          uVar24 = 0;
          do {
            pcVar3 = (char *)(namedArgs._288_8_ + uVar32 * 0x10);
            bVar13 = pcVar3[0xf];
            auVar38[0] = -(*pcVar3 == auVar44[0]);
            auVar38[1] = -(pcVar3[1] == auVar44[1]);
            auVar38[2] = -(pcVar3[2] == auVar44[2]);
            auVar38[3] = -(pcVar3[3] == auVar44[3]);
            auVar38[4] = -(pcVar3[4] == auVar44[4]);
            auVar38[5] = -(pcVar3[5] == auVar44[5]);
            auVar38[6] = -(pcVar3[6] == auVar44[6]);
            auVar38[7] = -(pcVar3[7] == auVar44[7]);
            auVar38[8] = -(pcVar3[8] == auVar44[8]);
            auVar38[9] = -(pcVar3[9] == auVar44[9]);
            auVar38[10] = -(pcVar3[10] == auVar44[10]);
            auVar38[0xb] = -(pcVar3[0xb] == auVar44[0xb]);
            auVar38[0xc] = -(pcVar3[0xc] == auVar44[0xc]);
            auVar38[0xd] = -(pcVar3[0xd] == auVar44[0xd]);
            auVar38[0xe] = -(pcVar3[0xe] == auVar44[0xe]);
            auVar38[0xf] = -(bVar13 == auVar44[0xf]);
            uVar15 = (uint)(ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe);
            if (uVar15 != 0) {
              lVar27 = namedArgs._288_8_ + uVar32 * 0x10;
              lVar33 = namedArgs._296_8_ + uVar32 * 0x1e0;
              local_398 = auVar44;
              do {
                iVar16 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> iVar16 & 1) == 0; iVar16 = iVar16 + 1) {
                  }
                }
                pbVar31 = (basic_string_view<char,_std::char_traits<char>_> *)
                          ((ulong)(uint)(iVar16 << 5) + lVar33);
                bVar12 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)&namedArgs.super_Storage.field_0x108,psVar26,pbVar31);
                oVar34 = local_488;
                if (bVar12) {
                  *(undefined1 *)&pbVar31[1]._M_str = 1;
                  propExpr = *(SyntaxNode **)(pbVar31[1]._M_len + 0x48);
                  if (propExpr != (SyntaxNode *)0x0) {
                    context_00 = (SmallVector<const_slang::ast::Symbol_*,_5UL> *)&context;
                    goto LAB_00422a47;
                  }
                  propExpr = *(SyntaxNode **)(local_488.t_ + 2);
                  LVar50 = LookupLocation::after(local_488.t_);
                  pAVar20 = local_490;
                  localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len =
                       CONCAT44(localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len.
                                _4_4_,LVar50.index);
                  localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[0] = '\0'
                  ;
                  localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[1] = '\0'
                  ;
                  localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[2] = '\0'
                  ;
                  localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[3] = '\0'
                  ;
                  localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[4] = '\0'
                  ;
                  localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[5] = '\0'
                  ;
                  localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[6] = '\0'
                  ;
                  localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[7] = '\0'
                  ;
                  localVars.stackBase[0] = '\0';
                  localVars.stackBase[1] = '\0';
                  localVars.stackBase[2] = '\0';
                  localVars.stackBase[3] = '\0';
                  localVars.stackBase[4] = '\0';
                  localVars.stackBase[5] = '\0';
                  localVars.stackBase[6] = '\0';
                  localVars.stackBase[7] = '\0';
                  localVars.stackBase[8] = '\0';
                  localVars.stackBase[9] = '\0';
                  localVars.stackBase[10] = '\0';
                  localVars.stackBase[0xb] = '\0';
                  localVars.stackBase[0xc] = '\0';
                  localVars.stackBase[0xd] = '\0';
                  localVars.stackBase[0xe] = '\0';
                  localVars.stackBase[0xf] = '\0';
                  localVars.stackBase[0x18] = '\x01';
                  localVars.stackBase._16_8_ = local_368;
                  localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 0x2000000000;
                  if (propExpr != (SyntaxNode *)0x0) goto LAB_004227f3;
                  bVar12 = true;
                  localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ =
                       (pointer)psVar1;
                  if (psVar26->_M_len == 0) goto LAB_00422c70;
                  sourceRange_02 =
                       slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pbVar31[1]._M_len);
                  code_00.subsystem = Expressions;
                  code_00.code = 0;
                  goto LAB_004227cb;
                }
                uVar15 = uVar15 - 1 & uVar15;
              } while (uVar15 != 0);
              bVar13 = *(byte *)(lVar27 + 0xf);
              auVar44 = local_398;
            }
            oVar34 = local_488;
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7] & bVar13) == 0) break;
            lVar33 = uVar32 + uVar24;
            uVar24 = uVar24 + 1;
            uVar32 = lVar33 + 1U & namedArgs._280_8_;
          } while (uVar24 <= (ulong)namedArgs._280_8_);
          propExpr = *(SyntaxNode **)(local_488.t_ + 2);
          LVar50 = LookupLocation::after(local_488.t_);
          pAVar20 = local_490;
          localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len =
               CONCAT44(localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len._4_4_,
                        LVar50.index);
          localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[0] = '\0';
          localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[1] = '\0';
          localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[2] = '\0';
          localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[3] = '\0';
          localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[4] = '\0';
          localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[5] = '\0';
          localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[6] = '\0';
          localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[7] = '\0';
          localVars.stackBase[0] = '\0';
          localVars.stackBase[1] = '\0';
          localVars.stackBase[2] = '\0';
          localVars.stackBase[3] = '\0';
          localVars.stackBase[4] = '\0';
          localVars.stackBase[5] = '\0';
          localVars.stackBase[6] = '\0';
          localVars.stackBase[7] = '\0';
          localVars.stackBase[8] = '\0';
          localVars.stackBase[9] = '\0';
          localVars.stackBase[10] = '\0';
          localVars.stackBase[0xb] = '\0';
          localVars.stackBase[0xc] = '\0';
          localVars.stackBase[0xd] = '\0';
          localVars.stackBase[0xe] = '\0';
          localVars.stackBase[0xf] = '\0';
          localVars.stackBase[0x18] = '\x01';
          localVars.stackBase._16_8_ = local_368;
          localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 0x2000000000;
          if (propExpr != (SyntaxNode *)0x0) {
LAB_004227f3:
            localVars.stackBase._16_8_ = local_368;
            localVars.stackBase[0x18] = '\x01';
            localVars.stackBase[8] = '\0';
            localVars.stackBase[9] = '\0';
            localVars.stackBase[10] = '\0';
            localVars.stackBase[0xb] = '\0';
            localVars.stackBase[0xc] = '\0';
            localVars.stackBase[0xd] = '\0';
            localVars.stackBase[0xe] = '\0';
            localVars.stackBase[0xf] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[0] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[1] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[2] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[3] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[4] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[5] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[6] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[7] = '\0';
            localVars.stackBase[0] = '\0';
            localVars.stackBase[1] = '\0';
            localVars.stackBase[2] = '\0';
            localVars.stackBase[3] = '\0';
            localVars.stackBase[4] = '\0';
            localVars.stackBase[5] = '\0';
            localVars.stackBase[6] = '\0';
            localVars.stackBase[7] = '\0';
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 0x2000000000;
            context_00 = &localVars;
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)psVar1;
            goto LAB_00422a47;
          }
          if (namedArgs._312_8_ == 0) {
            sourceRange_01.endLoc = range_local.endLoc;
            sourceRange_01.startLoc = range_local.startLoc;
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)psVar1;
            pDVar17 = ASTContext::addDiag(&context,(DiagCode)0x9f0007,sourceRange_01);
            arg_02._M_len = *(size_t *)&(pAVar20->super_Expression).type;
            arg_02._M_str = (char *)(pAVar20->super_Expression).constant;
            Diagnostic::operator<<(pDVar17,arg_02);
            local_3d8._0_8_ = _Var6;
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ::emplace_back<unsigned_long>(&pDVar17->args,(unsigned_long *)local_3d8);
            local_3d8._0_8_ =
                 orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len;
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ::emplace_back<unsigned_long>(&pDVar17->args,(unsigned_long *)local_3d8);
            bVar12 = true;
            break;
          }
          bVar12 = true;
          localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)psVar1;
          if (psVar26->_M_len != 0) {
            sourceRange_02.endLoc = range_local.endLoc;
            sourceRange_02.startLoc = range_local.startLoc;
            code_00.subsystem = Expressions;
            code_00.code = 0xa2;
LAB_004227cb:
            pDVar17 = ASTContext::addDiag(&context,code_00,sourceRange_02);
            bVar12 = true;
            Diagnostic::operator<<(pDVar17,(oVar34.t_)->name);
          }
        }
LAB_00422c70:
        poVar30 = poVar30 + 1;
      } while (poVar30 != local_2d0);
    }
    if (local_468 < orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len) {
      sourceRange.endLoc = range_local.endLoc;
      sourceRange.startLoc = range_local.startLoc;
      pDVar17 = ASTContext::addDiag(&context,(DiagCode)0xa00007,sourceRange);
      arg_00._M_len = *(size_t *)&(pAVar20->super_Expression).type;
      arg_00._M_str = (char *)(pAVar20->super_Expression).constant;
      Diagnostic::operator<<(pDVar17,arg_00);
      localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)_Var6;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar17->args,(unsigned_long *)&localVars);
      localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ =
           (pointer)orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar17->args,(unsigned_long *)&localVars);
      bVar12 = true;
    }
    iVar48 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
             ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                      *)&namedArgs.super_Storage.field_0x108);
    if (iVar48.p_ != (table_element_pointer)0x0) {
LAB_00422178:
      do {
        ppVar25 = iVar48.p_;
        if ((ppVar25->second).second == false) {
          SVar18 = parsing::Token::location(&((ppVar25->second).first)->name);
          pDVar17 = ASTContext::addDiag(&context,(DiagCode)0x10007,SVar18);
          sVar49 = parsing::Token::valueText(&((ppVar25->second).first)->name);
          Diagnostic::operator<<(pDVar17,sVar49);
          arg_01._M_len = *(size_t *)&(local_490->super_Expression).type;
          arg_01._M_str = (char *)(local_490->super_Expression).constant;
          bVar12 = true;
          Diagnostic::operator<<(pDVar17,arg_01);
        }
        puVar23 = iVar48.pc_ + 0x12;
        puVar29 = iVar48.pc_ + 2;
LAB_004221da:
        puVar19 = puVar29;
        puVar29 = iVar48.pc_;
        ppVar25 = iVar48.p_ + 1;
        pAVar20 = local_490;
        if (((uint)iVar48.pc_ & 0xf) != 0xe) goto code_r0x004221e9;
        auVar36[0] = -(*puVar19 == '\0');
        auVar36[1] = -(puVar19[1] == '\0');
        auVar36[2] = -(puVar19[2] == '\0');
        auVar36[3] = -(puVar19[3] == '\0');
        auVar36[4] = -(puVar19[4] == '\0');
        auVar36[5] = -(puVar19[5] == '\0');
        auVar36[6] = -(puVar19[6] == '\0');
        auVar36[7] = -(puVar19[7] == '\0');
        auVar36[8] = -(puVar19[8] == '\0');
        auVar36[9] = -(puVar19[9] == '\0');
        auVar36[10] = -(puVar19[10] == '\0');
        auVar36[0xb] = -(puVar19[0xb] == '\0');
        auVar36[0xc] = -(puVar19[0xc] == '\0');
        auVar36[0xd] = -(puVar19[0xd] == '\0');
        auVar36[0xe] = -(puVar19[0xe] == '\0');
        auVar36[0xf] = -(puVar19[0xf] == '\0');
        uVar9 = (ushort)(SUB161(auVar36 >> 7,0) & 1) | (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe;
        while (uVar9 == 0x7fff) {
          ppVar25 = ppVar25 + 0xf;
          auVar37[0] = -(*puVar23 == '\0');
          auVar37[1] = -(puVar23[1] == '\0');
          auVar37[2] = -(puVar23[2] == '\0');
          auVar37[3] = -(puVar23[3] == '\0');
          auVar37[4] = -(puVar23[4] == '\0');
          auVar37[5] = -(puVar23[5] == '\0');
          auVar37[6] = -(puVar23[6] == '\0');
          auVar37[7] = -(puVar23[7] == '\0');
          auVar37[8] = -(puVar23[8] == '\0');
          auVar37[9] = -(puVar23[9] == '\0');
          auVar37[10] = -(puVar23[10] == '\0');
          auVar37[0xb] = -(puVar23[0xb] == '\0');
          auVar37[0xc] = -(puVar23[0xc] == '\0');
          auVar37[0xd] = -(puVar23[0xd] == '\0');
          auVar37[0xe] = -(puVar23[0xe] == '\0');
          auVar37[0xf] = -(puVar23[0xf] == '\0');
          puVar19 = puVar23;
          puVar23 = puVar23 + 0x10;
          uVar9 = (ushort)(SUB161(auVar37 >> 7,0) & 1) | (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe;
        }
        uVar15 = 0;
        if ((uVar9 ^ 0x7fff) != 0) {
          for (; ((uVar9 ^ 0x7fff) >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        if (puVar19[uVar15] == '\x01') break;
        iVar48.p_ = (table_element_pointer)((long)&(ppVar25->first)._M_len + (ulong)(uVar15 << 5));
        iVar48.pc_ = puVar19 + uVar15;
      } while( true );
    }
LAB_004223b0:
    local_3d8._8_4_ = 0xffffffff;
    local_3d8._0_8_ = psVar1;
    local_3c8 = (undefined1  [16])0x0;
    local_3b8 = (undefined1  [16])0x0;
    local_3a8 = (AssertionInstanceDetails *)local_368;
    if (((undefined1  [16])context._16_16_ & (undefined1  [16])0x600000) != (undefined1  [16])0x0) {
      local_3c8._0_8_ = context.flags.m_bits & 0x400000 | 0x200000;
      if (((uint)context.flags.m_bits >> 0x15 & 1) == 0) {
        local_3c8._0_8_ = 0x400000;
      }
      local_3c8._8_8_ = 0;
    }
    if ((pAVar20->super_Expression).kind == 0x55) {
      pAVar20 = (AssertionInstanceExpression *)
                Expression::create(this_00,(ExpressionSyntax *)
                                           pAVar20[1].super_Expression.sourceRange.startLoc,
                                   (ASTContext *)local_3d8,(bitmask<slang::ast::ASTFlags>)0x0,
                                   (Type *)0x0);
    }
    else {
      pcVar3 = localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement;
      localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len = 0;
      localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 5;
      localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)pcVar3;
      args_2_00 = bindAssertionBody((Symbol *)pAVar20,(SyntaxNode *)pAVar20->body,
                                    (ASTContext *)local_3d8,local_450,
                                    (AssertionInstanceDetails *)local_368,
                                    &localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>);
      arg.
      super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
      .
      super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
      .
      super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
      .
      super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
      .
      super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
      .
      super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
      ._M_u = (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               )((ulong)arg.
                        super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        .
                        super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        .
                        super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        .
                        super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        .
                        super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        .
                        super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        ._M_u & 0xffffffffffffff00);
      pAVar20 = BumpAllocator::
                emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                          ((BumpAllocator *)this_00,args,(Symbol *)pAVar20,args_2_00,(bool *)&arg,
                           &range_local);
      iVar16 = SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
               ::copy(&actualArgs.
                       super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
                      ,(EVP_PKEY_CTX *)this_00,src);
      (pAVar20->arguments)._M_ptr = (pointer)CONCAT44(extraout_var,iVar16);
      (pAVar20->arguments)._M_extent._M_extent_value = (size_t)src_00;
      iVar16 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                         (&localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>,
                          (EVP_PKEY_CTX *)this_00,src_00);
      (pAVar20->localVars)._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar16);
      (pAVar20->localVars)._M_extent._M_extent_value = extraout_RDX;
      if (local_2e0 == true) {
        code_01.subsystem = Expressions;
        code_01.code = 0x8f;
        if ((((uint)context.flags.m_bits >> 0x16 & 1) == 0) ||
           (code_01.subsystem = Expressions, code_01.code = 0x8e,
           ((uint)context.flags.m_bits >> 0x15 & 1) != 0)) {
          sourceRange_00.endLoc = range_local.endLoc;
          sourceRange_00.startLoc = range_local.startLoc;
          ASTContext::addDiag(&context,code_01,sourceRange_00);
        }
      }
      if (bVar12 || args_2_00->kind == Invalid) {
        pAVar20 = (AssertionInstanceExpression *)
                  Expression::badExpr(this_00,&pAVar20->super_Expression);
      }
      if (localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ != (pointer)pcVar3) {
        operator_delete(localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_);
      }
    }
    if (actualArgs.
        super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
        .data_ != (pointer)actualArgs.
                           super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
                           .firstElement) {
      operator_delete(actualArgs.
                      super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
                      .data_);
    }
LAB_004222ec:
    if (local_308 != (value_type_pointer)0x0) {
      operator_delete(local_308,((local_318 * 0x178 + 0x186) / 3 & 0xfffffffffffffff8) * 3);
    }
    if (local_338 != (value_type_pointer)0x0) {
      operator_delete(local_338,((local_348 * 0x448 + 0x456) / 9 & 0xfffffffffffffff8) * 9);
    }
  }
  else {
    pAVar20 = (AssertionInstanceExpression *)Expression::badExpr(this_00,(Expression *)0x0);
  }
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::delete_((allocator_type)namedArgs.super_Storage._264_8_,
            (table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
             *)&namedArgs.field_0x110);
  if (orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_ !=
      (pointer)orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.firstElement) {
    operator_delete(orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_);
  }
  return &pAVar20->super_Expression;
code_r0x004221e9:
  iVar48.p_ = ppVar25;
  iVar48.pc_ = puVar29 + 1;
  puVar23 = puVar23 + 1;
  puVar29 = puVar19 + 1;
  if (puVar19[-1] != '\0') goto code_r0x004221fa;
  goto LAB_004221da;
code_r0x004221fa:
  if (puVar19[-1] == '\x01') goto LAB_004223b0;
  iVar48.pc_ = puVar19 + -1;
  goto LAB_00422178;
}

Assistant:

Expression& AssertionInstanceExpression::fromLookup(const Symbol& symbol,
                                                    const InvocationExpressionSyntax* syntax,
                                                    SourceRange range,
                                                    const ASTContext& parentContext) {
    auto& comp = parentContext.getCompilation();
    const Type* type;
    const Scope* symbolScope;
    std::span<const AssertionPortSymbol* const> formalPorts;

    comp.noteReference(symbol);
    switch (symbol.kind) {
        case SymbolKind::Sequence: {
            auto& seq = symbol.as<SequenceSymbol>();
            type = &comp.getType(SyntaxKind::SequenceType);
            formalPorts = seq.ports;
            symbolScope = &seq;
            break;
        }
        case SymbolKind::Property: {
            auto& prop = symbol.as<PropertySymbol>();
            type = &comp.getType(SyntaxKind::PropertyType);
            formalPorts = prop.ports;
            symbolScope = &prop;
            break;
        }
        case SymbolKind::LetDecl: {
            auto& let = symbol.as<LetDeclSymbol>();
            type = &comp.getVoidType();
            formalPorts = let.ports;
            symbolScope = &let;
            break;
        }
        default:
            SLANG_UNREACHABLE;
    }

    SmallVector<const SyntaxNode*> orderedArgs;
    NamedArgMap namedArgs;
    if (syntax && syntax->arguments) {
        if (!collectArgs(parentContext, *syntax->arguments, orderedArgs, namedArgs))
            return badExpr(comp, nullptr);
    }

    ASTContext context = parentContext;
    context.tryFillAssertionDetails();

    AssertionInstanceDetails instance;
    instance.symbol = &symbol;
    instance.prevContext = &context;
    instance.instanceLoc = range.start();

    // Check for recursive instantiation. This is illegal for sequences, and allowed in
    // some forms for properties.
    auto currInst = context.assertionInstance;
    while (currInst) {
        if (currInst->symbol == &symbol) {
            if (symbol.kind == SymbolKind::Sequence) {
                context.addDiag(diag::RecursiveSequence, range) << symbol.name;
                return badExpr(comp, nullptr);
            }
            else if (symbol.kind == SymbolKind::LetDecl) {
                context.addDiag(diag::RecursiveLet, range) << symbol.name;
                return badExpr(comp, nullptr);
            }

            // Properties are allowed to be recursive, but we should avoid trying
            // to expand them because that will continue forever. Instead, we want
            // to expand one time for each unique invocation of the property and when
            // we encounter it again we should mark a placeholder and return to stop
            // the recursion.
            if (currInst->isRecursive) {
                auto& body = *comp.emplace<InvalidAssertionExpr>(nullptr);
                return *comp.emplace<AssertionInstanceExpression>(*type, symbol, body,
                                                                  /* isRecursiveProperty */ true,
                                                                  range);
            }
            instance.isRecursive = true;
        }

        if (currInst->argDetails)
            currInst = currInst->argDetails;
        else {
            SLANG_ASSERT(currInst->prevContext);
            currInst = currInst->prevContext->assertionInstance;
        }
    }

    // Now map all arguments to their formal ports.
    bool bad = false;
    uint32_t orderedIndex = 0;
    SourceLocation outputLocalVarArgLoc;
    SmallVector<std::tuple<const Symbol*, ActualArg>, 4> actualArgs;

    for (auto formal : formalPorts) {
        const ASTContext* argCtx = &context;
        const PropertyExprSyntax* expr = nullptr;
        std::optional<ASTContext> defValCtx;

        auto setDefault = [&] {
            expr = formal->defaultValueSyntax;
            defValCtx.emplace(*symbolScope, LookupLocation::after(*formal));
            defValCtx->assertionInstance = &instance;
            defValCtx->flags |= ASTFlags::AssertionDefaultArg;
            argCtx = &defValCtx.value();
        };

        if (orderedIndex < orderedArgs.size()) {
            auto arg = orderedArgs[orderedIndex++];
            if (arg->kind == SyntaxKind::EmptyArgument) {
                // Empty arguments are allowed as long as a default is provided.
                setDefault();
                if (!expr && !formal->name.empty())
                    context.addDiag(diag::ArgCannotBeEmpty, arg->sourceRange()) << formal->name;
            }
            else {
                expr = &arg->as<PropertyExprSyntax>();
            }

            // Make sure there isn't also a named value for this argument.
            if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
                auto& diag = context.addDiag(diag::DuplicateArgAssignment,
                                             it->second.first->name.location());
                diag << formal->name;
                diag.addNote(diag::NotePreviousUsage, arg->getFirstToken().location());
                it->second.second = true;
                bad = true;
            }
        }
        else if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
            // Mark this argument as used so that we can later detect if
            // any were unused.
            it->second.second = true;

            expr = it->second.first->expr;
            if (!expr) {
                // Empty arguments are allowed as long as a default is provided.
                setDefault();
                if (!expr && !formal->name.empty()) {
                    context.addDiag(diag::ArgCannotBeEmpty, it->second.first->sourceRange())
                        << formal->name;
                }
            }
        }
        else {
            setDefault();
            if (!expr) {
                if (namedArgs.empty()) {
                    auto& diag = context.addDiag(diag::TooFewArguments, range);
                    diag << symbol.name;
                    diag << formalPorts.size() << orderedArgs.size();
                    bad = true;
                    break;
                }
                else if (!formal->name.empty()) {
                    context.addDiag(diag::UnconnectedArg, range) << formal->name;
                }
            }
        }

        if (!expr) {
            bad = true;
            continue;
        }

        // Map the expression to the port symbol; this will be looked up later
        // when we encounter uses in the sequence / property body.
        instance.argumentMap.emplace(formal, std::make_tuple(expr, *argCtx));

        // Do type checking for all arguments now, even though the actuals will remain as
        // syntax nodes and be rebound when we actually encounter uses of them in the body.
        // This is because the arguments might not actually be used anywhere in the body,
        // so the only place to detect mismatches is here, but we can't save the bound
        // form because assertion item arguments are replaced as-is for each usage.
        ActualArg arg;
        if (!checkAssertionArg(*expr, *formal, *argCtx, arg, instance.isRecursive))
            bad = true;
        else
            actualArgs.push_back({formal, arg});

        if (!outputLocalVarArgLoc && (formal->direction == ArgumentDirection::InOut ||
                                      formal->direction == ArgumentDirection::Out)) {
            outputLocalVarArgLoc = formal->location;
        }
    }

    // Make sure there weren't too many ordered arguments provided.
    if (orderedIndex < orderedArgs.size()) {
        auto& diag = context.addDiag(diag::TooManyArguments, range);
        diag << symbol.name;
        diag << formalPorts.size();
        diag << orderedArgs.size();
        bad = true;
    }

    for (auto& pair : namedArgs) {
        // We marked all the args that we used, so anything left over is an arg assignment
        // for a non-existent arg.
        if (!pair.second.second) {
            auto& diag = context.addDiag(diag::ArgDoesNotExist, pair.second.first->name.location());
            diag << pair.second.first->name.valueText();
            diag << symbol.name;
            bad = true;
        }
    }

    ASTContext bodyContext(*symbolScope, LookupLocation::max);
    bodyContext.assertionInstance = &instance;

    // Propagate previously determined time advance specs and negation operators
    if (context.flags.has(ASTFlags::PropertyTimeAdvance))
        bodyContext.flags |= ASTFlags::PropertyTimeAdvance;
    if (context.flags.has(ASTFlags::PropertyNegation))
        bodyContext.flags |= ASTFlags::PropertyNegation;

    // Let declarations expand directly to an expression.
    if (symbol.kind == SymbolKind::LetDecl)
        return create(comp, *symbol.as<LetDeclSymbol>().exprSyntax, bodyContext);

    // Now instantiate by creating the assertion expression of the sequence / property body.
    auto bodySyntax = symbol.getSyntax();
    SLANG_ASSERT(bodySyntax);

    SmallVector<const Symbol*> localVars;
    auto& body = bindAssertionBody(symbol, *bodySyntax, bodyContext, outputLocalVarArgLoc, instance,
                                   localVars);

    auto result = comp.emplace<AssertionInstanceExpression>(*type, symbol, body,
                                                            /* isRecursiveProperty */ false, range);
    result->arguments = actualArgs.copy(comp);
    result->localVars = localVars.copy(comp);

    if (instance.isRecursive) {
        if (!context.flags.has(ASTFlags::PropertyTimeAdvance))
            context.addDiag(diag::RecursivePropTimeAdvance, range);
        else if (context.flags.has(ASTFlags::PropertyNegation))
            context.addDiag(diag::RecursivePropNegation, range);
    }

    if (bad || body.bad())
        return badExpr(comp, result);

    return *result;
}